

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O2

void __thiscall
TileData::TileData(TileData *this,t id,t state1,t state2,t dir,bool highlight,uint16_t meta)

{
  undefined7 in_register_00000089;
  
  _meta = (uint)meta;
  *this = (TileData)
          (_meta << 0x10 |
          (int)CONCAT71(in_register_00000089,highlight) << 0xe |
          (dir & 3) << 0xc |
          (state2 & 3) << 10 | (state1 & 3) << 8 | (uint)*this & 0x80e0 | id & 0x1f);
  return;
}

Assistant:

TileData::TileData(TileId::t id, State::t state1, State::t state2, Direction::t dir, bool highlight, uint16_t meta) :
    id(id),
    state1(state1),
    state2(state2),
    dir(dir),
    highlight(highlight),
    meta(meta) {
}